

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O2

int AF_A_FAxeCheckAtk(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *player;
  AWeapon *this_00;
  bool bVar2;
  AAmmo *pAVar3;
  FState *state;
  char *__assertion;
  DObject *this_01;
  FName local_24;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00538a62;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_01 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_01 == (DObject *)0x0) {
LAB_0053896c:
        this_01 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00538a62;
        }
      }
      if (numparam == 1) goto LAB_005389e9;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00538a52;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00538a62;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00538a52;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005389e9:
        player = *(player_t **)&this_01[0xc].ObjectFlags;
        if (player != (player_t *)0x0) {
          pAVar3 = GC::ReadBarrier<AAmmo>((AAmmo **)&player->ReadyWeapon->Ammo1);
          if ((pAVar3->super_AInventory).Amount != 0) {
            this_00 = player->ReadyWeapon;
            FName::FName(&local_24,"FireGlow");
            state = AActor::FindState((AActor *)this_00,&local_24);
            P_SetPsprite(player,PSP_WEAPON,state,false);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00538a62;
    }
    if (this_01 == (DObject *)0x0) goto LAB_0053896c;
  }
LAB_00538a52:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00538a62:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,0xb1,"int AF_A_FAxeCheckAtk(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeCheckAtk)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	if (player->ReadyWeapon->Ammo1->Amount)
	{
		P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("FireGlow"));
	}
	return 0;
}